

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

bool __thiscall
google::protobuf::UnknownFieldSet::ParseFromCodedStream
          (UnknownFieldSet *this,CodedInputStream *input)

{
  bool bVar1;
  
  Clear(this);
  bVar1 = MergeFromCodedStream(this,input);
  return bVar1;
}

Assistant:

bool UnknownFieldSet::ParseFromCodedStream(io::CodedInputStream* input) {
  Clear();
  return MergeFromCodedStream(input);
}